

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_rsn_hess_face(REF_GRID ref_grid,REF_DBL *hessian)

{
  double *pdVar1;
  double dVar2;
  REF_NODE ref_node;
  REF_NODE pRVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  REF_CLOUD *one_layer;
  REF_ADJ pRVar11;
  ulong uVar12;
  undefined8 uVar13;
  REF_DBL *pRVar14;
  REF_CLOUD *ref_cloud_ptr;
  REF_STATUS RVar15;
  long lVar16;
  REF_GLOB RVar17;
  char *pcVar18;
  REF_CELL pRVar19;
  REF_INT node;
  long lVar20;
  REF_BOOL has_support;
  REF_GRID local_120;
  REF_DBL *local_118;
  REF_DBL *local_110;
  REF_CLOUD ref_cloud;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT geom;
  long local_f0;
  ulong local_e8;
  REF_CELL local_e0;
  REF_FACELIFT local_d8;
  REF_GEOM local_d0;
  REF_DBL node_hessian [3];
  REF_DBL local_a8;
  REF_DBL local_a0;
  REF_DBL local_98;
  double local_90;
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL n [3];
  
  ref_node = ref_grid->node;
  pRVar19 = ref_grid->cell[3];
  uVar9 = ref_node->max;
  uVar10 = 0;
  uVar12 = 0;
  pRVar14 = hessian;
  if (0 < (int)uVar9) {
    uVar12 = (ulong)uVar9;
  }
  for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
    if (-1 < ref_node->global[uVar10]) {
      *pRVar14 = 0.0;
      pRVar14[1] = 0.0;
      pRVar14[2] = 0.0;
    }
    pRVar14 = pRVar14 + 3;
  }
  if ((int)uVar9 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b6,
           "ref_recon_rsn_hess_face","malloc one_layer of REF_CLOUD negative");
    RVar15 = 1;
  }
  else {
    local_120 = ref_grid;
    local_110 = hessian;
    one_layer = (REF_CLOUD *)malloc((ulong)uVar9 * 8);
    if (one_layer == (REF_CLOUD *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b6
             ,"ref_recon_rsn_hess_face","malloc one_layer of REF_CLOUD NULL");
      RVar15 = 2;
    }
    else {
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        one_layer[uVar10] = (REF_CLOUD)0x0;
      }
      uVar6 = ref_cell_id_range(pRVar19,local_120->mpi,&min_id,&max_id);
      uVar9 = min_id;
      if (uVar6 == 0) {
        for (; (int)uVar9 <= max_id; uVar9 = uVar9 + 1) {
          ref_cloud_ptr = one_layer;
          for (lVar20 = 0; lVar20 < ref_node->max; lVar20 = lVar20 + 1) {
            if ((-1 < ref_node->global[lVar20]) &&
               (uVar6 = ref_cloud_create(ref_cloud_ptr,4), uVar6 != 0)) {
              uVar10 = (ulong)uVar6;
              pcVar18 = "cloud storage";
              uVar13 = 0x6bc;
              goto LAB_001af893;
            }
            ref_cloud_ptr = ref_cloud_ptr + 1;
          }
          pRVar3 = local_120->node;
          pRVar19 = local_120->cell[3];
          local_d0 = local_120->geom;
          local_d8 = local_d0->ref_facelift;
          for (lVar20 = 0; lVar20 < pRVar3->max; lVar20 = lVar20 + 1) {
            if ((-1 < pRVar3->global[lVar20]) && (pRVar3->ref_mpi->id == pRVar3->part[lVar20])) {
              pRVar11 = pRVar19->ref_adj;
              iVar8 = -1;
              uVar10 = 0xffffffff;
              local_f0 = lVar20;
              local_e0 = pRVar19;
              if (lVar20 < pRVar11->nnode) {
                uVar6 = pRVar11->first[lVar20];
                iVar8 = -1;
                uVar10 = 0xffffffff;
                if ((long)(int)uVar6 != -1) {
                  iVar8 = pRVar11->item[(int)uVar6].ref;
                  uVar10 = (ulong)uVar6;
                }
              }
              while ((int)uVar10 != -1) {
                local_118 = (REF_DBL *)(long)iVar8;
                if (pRVar19->c2n
                    [(long)pRVar19->size_per * (long)local_118 + (long)pRVar19->node_per] == uVar9)
                {
                  lVar20 = 0;
                  local_e8 = uVar10;
LAB_001af433:
                  if ((int)lVar20 < pRVar19->node_per) {
                    iVar8 = pRVar19->c2n[(long)pRVar19->size_per * (long)local_118 + lVar20];
                    lVar16 = (long)iVar8;
                    RVar17 = -1;
                    if ((-1 < lVar16) && (iVar8 < pRVar3->max)) {
                      RVar17 = pRVar3->global[lVar16];
                      if (pRVar3->global[lVar16] < 0) {
                        RVar17 = -1;
                      }
                    }
                    pRVar14 = pRVar3->real;
                    local_a8 = pRVar14[lVar16 * 0xf];
                    local_a0 = pRVar14[lVar16 * 0xf + 1];
                    local_98 = pRVar14[lVar16 * 0xf + 2];
                    uVar6 = ref_geom_find(local_d0,iVar8,2,uVar9,&geom);
                    if (uVar6 == 0) goto code_r0x001af4cc;
                    pcVar18 = "find geom";
                    uVar13 = 0x301;
                    goto LAB_001af868;
                  }
                  pRVar11 = pRVar19->ref_adj;
                  lVar20 = local_f0;
                  uVar10 = local_e8;
                }
                uVar10 = (ulong)pRVar11->item[(int)uVar10].next;
                iVar8 = -1;
                if (uVar10 != 0xffffffffffffffff) {
                  iVar8 = pRVar11->item[uVar10].ref;
                }
              }
            }
          }
          uVar6 = ref_recon_ghost_cloud(one_layer,ref_node);
          if (uVar6 != 0) {
            uVar10 = (ulong)uVar6;
            pcVar18 = "fill ghosts";
            uVar13 = 0x6c0;
            goto LAB_001af893;
          }
          lVar20 = 0;
          pRVar14 = local_110;
          while( true ) {
            uVar10 = (ulong)ref_node->max;
            if ((long)uVar10 <= lVar20) break;
            if (-1 < ref_node->global[lVar20]) {
              node = (REF_INT)lVar20;
              local_118 = pRVar14;
              uVar6 = ref_geom_id_supported(local_120->geom,node,2,uVar9,&has_support);
              if (uVar6 != 0) {
                uVar10 = (ulong)uVar6;
                pcVar18 = "geom support";
                uVar13 = 0x6c5;
                goto LAB_001af893;
              }
              pRVar14 = local_118;
              if ((has_support != 0) && (ref_node->ref_mpi->id == ref_node->part[lVar20])) {
                uVar6 = ref_recon_rsn(local_120,node,r,s,n);
                if (uVar6 != 0) {
                  uVar10 = (ulong)uVar6;
                  pcVar18 = "rsn";
                  uVar13 = 0x6c7;
                  goto LAB_001af893;
                }
                uVar6 = ref_cloud_deep_copy(&ref_cloud,one_layer[lVar20]);
                if (uVar6 != 0) {
                  uVar10 = (ulong)uVar6;
                  pcVar18 = "create ref_cloud";
                  uVar13 = 0x6ca;
                  goto LAB_001af893;
                }
                iVar8 = 3;
                for (uVar6 = 2; (iVar8 != 0 && (uVar6 < 9)); uVar6 = uVar6 + 1) {
                  uVar7 = ref_recon_grow_cloud_one_layer(ref_cloud,one_layer,ref_node);
                  if (uVar7 != 0) {
                    uVar10 = (ulong)uVar7;
                    pcVar18 = "grow";
                    uVar13 = 0x6ce;
                    goto LAB_001af893;
                  }
                  RVar17 = -1;
                  if (lVar20 < ref_node->max) {
                    RVar17 = ref_node->global[lVar20];
                    if (ref_node->global[lVar20] < 0) {
                      RVar17 = -1;
                    }
                  }
                  iVar8 = ref_recon_kexact_rs(RVar17,ref_cloud,r,s,node_hessian);
                  pcVar18 = "REF_DIV_ZERO";
                  if ((iVar8 == 4 && 4 < uVar6) ||
                     (pcVar18 = "REF_ILL_CONDITIONED", iVar8 == 8 && 4 < uVar6)) {
                    ref_node_location(ref_node,node);
                    printf(" caught %s, for %d layers to kexact cloud; retry\n",pcVar18,(ulong)uVar6
                          );
                  }
                }
                if (iVar8 == 0) {
                  if (local_110[lVar20 * 3 + 2] * local_110[lVar20 * 3 + 2] +
                      local_110[lVar20 * 3] * local_110[lVar20 * 3] +
                      local_110[lVar20 * 3 + 1] * local_110[lVar20 * 3 + 1] <
                      node_hessian[2] * node_hessian[2] +
                      node_hessian[0] * node_hessian[0] + node_hessian[1] * node_hessian[1]) {
                    for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
                      local_118[lVar16] = node_hessian[lVar16];
                    }
                  }
                }
                else {
                  printf("skip contribution to face %d at ",(ulong)uVar9);
                  uVar6 = ref_node_location(ref_node,node);
                  if (uVar6 != 0) {
                    uVar10 = (ulong)uVar6;
                    pcVar18 = "loc";
                    uVar13 = 0x6e6;
                    goto LAB_001af893;
                  }
                }
                uVar6 = ref_cloud_free(ref_cloud);
                pRVar14 = local_118;
                if (uVar6 != 0) {
                  uVar10 = (ulong)uVar6;
                  pcVar18 = "free ref_cloud";
                  uVar13 = 0x6e9;
                  goto LAB_001af893;
                }
              }
            }
            lVar20 = lVar20 + 1;
            pRVar14 = pRVar14 + 3;
          }
          for (lVar20 = 0; lVar20 < (int)uVar10; lVar20 = lVar20 + 1) {
            if (-1 < ref_node->global[lVar20]) {
              ref_cloud_free(one_layer[lVar20]);
              uVar10 = (ulong)(uint)ref_node->max;
            }
          }
        }
        free(one_layer);
        pRVar14 = local_110;
        uVar9 = ref_node_ghost_dbl(ref_node,local_110,3);
        if (uVar9 == 0) {
          uVar9 = ref_recon_abs_value_hessian2(local_120,pRVar14);
          if (uVar9 == 0) {
            return 0;
          }
          uVar10 = (ulong)uVar9;
          pcVar18 = "abs(H)";
          uVar13 = 0x6f5;
        }
        else {
          uVar10 = (ulong)uVar9;
          pcVar18 = "update ghosts";
          uVar13 = 0x6f3;
        }
      }
      else {
        uVar10 = (ulong)uVar6;
        pcVar18 = "face id range";
        uVar13 = 0x6b8;
      }
LAB_001af893:
      RVar15 = (REF_STATUS)uVar10;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
             uVar13,"ref_recon_rsn_hess_face",uVar10,pcVar18);
    }
  }
  return RVar15;
code_r0x001af4cc:
  dVar2 = local_d8->displacement[(long)geom * 3];
  pdVar1 = local_d8->displacement + (long)geom * 3 + 1;
  dVar4 = *pdVar1;
  dVar5 = pdVar1[1];
  local_90 = SQRT(dVar5 * dVar5 + dVar2 * dVar2 + dVar4 * dVar4);
  uVar6 = ref_cloud_store(one_layer[local_f0],RVar17,&local_a8);
  lVar20 = lVar20 + 1;
  pRVar19 = local_e0;
  if (uVar6 != 0) {
    pcVar18 = "store could stencil";
    uVar13 = 0x304;
LAB_001af868:
    uVar10 = (ulong)uVar6;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar13,
           "ref_recon_local_immediate_cloud_geom",uVar10,pcVar18);
    pcVar18 = "fill immediate cloud";
    uVar13 = 0x6bf;
    goto LAB_001af893;
  }
  goto LAB_001af433;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn_hess_face(REF_GRID ref_grid,
                                           REF_DBL *hessian) {
  REF_CLOUD *one_layer;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node, im, min_id, max_id, id;
  REF_CLOUD ref_cloud;
  REF_DBL r[3], s[3], n[3];
  REF_DBL node_hessian[3];
  REF_STATUS status;
  REF_INT layer;
  REF_BOOL has_support;

  each_ref_node_valid_node(ref_node, node) {
    hessian[0 + 3 * node] = 0.0;
    hessian[1 + 3 * node] = 0.0;
    hessian[2 + 3 * node] = 0.0;
  }

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  RSS(ref_cell_id_range(ref_cell, ref_grid_mpi(ref_grid), &min_id, &max_id),
      "face id range");

  for (id = min_id; id <= max_id; id++) {
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
    }
    RSS(ref_recon_local_immediate_cloud_geom(one_layer, ref_grid, id),
        "fill immediate cloud");
    RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_geom_id_supported(ref_grid_geom(ref_grid), node, REF_GEOM_FACE,
                                id, &has_support),
          "geom support");
      if (has_support && ref_node_owned(ref_node, node)) {
        RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
        /* use ref_cloud to get a unique list of halo(2) nodes */
        RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]),
            "create ref_cloud");
        status = REF_INVALID;
        for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
          RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
              "grow");

          status = ref_recon_kexact_rs(ref_node_global(ref_node, node),
                                       ref_cloud, r, s, node_hessian);
          if (REF_DIV_ZERO == status && layer > 4) {
            ref_node_location(ref_node, node);
            printf(" caught %s, for %d layers to kexact cloud; retry\n",
                   "REF_DIV_ZERO", layer);
          }
          if (REF_ILL_CONDITIONED == status && layer > 4) {
            ref_node_location(ref_node, node);
            printf(" caught %s, for %d layers to kexact cloud; retry\n",
                   "REF_ILL_CONDITIONED", layer);
          }
        }
        if (REF_SUCCESS == status) {
          if (ref_math_dot(&(hessian[3 * node]), &(hessian[3 * node])) <
              ref_math_dot(node_hessian, node_hessian)) {
            for (im = 0; im < 3; im++) {
              hessian[im + 3 * node] = node_hessian[im];
            }
          }
        } else {
          printf("skip contribution to face %d at ", id);
          RSS(ref_node_location(ref_node, node), "loc");
        }

        RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      ref_cloud_free(one_layer[node]); /* no-op for null */
    }
  }
  ref_free(one_layer);

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  RSS(ref_recon_abs_value_hessian2(ref_grid, hessian), "abs(H)");

  return REF_SUCCESS;
}